

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.cpp
# Opt level: O0

void __thiscall
lzham::task_pool::task_pool(task_pool *this,lzham_malloc_context malloc_context,uint num_threads)

{
  uint uVar1;
  uint in_EDX;
  tsstack<lzham::task_pool::task,_64U> *in_RSI;
  task_pool *in_RDI;
  bool status;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  task_pool *initialCount;
  undefined4 in_stack_ffffffffffffffe8;
  
  initialCount = in_RDI;
  tsstack<lzham::task_pool::task,_64U>::tsstack
            (in_RSI,(lzham_malloc_context)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  initialCount->m_num_threads = 0;
  semaphore::semaphore
            (&initialCount->m_tasks_available,(long)initialCount,(long)in_RDI,
             (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  in_RDI->m_malloc_context = in_RSI;
  in_RDI->m_num_outstanding_tasks = 0;
  in_RDI->m_exit_flag = 0;
  utils::zero_object<unsigned_long[64]>((unsigned_long (*) [64])0x11f11f);
  uVar1 = init(in_RDI,(EVP_PKEY_CTX *)(ulong)in_EDX);
  if ((uVar1 & 1) == 0) {
    lzham_assert("status",
                 "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamcomp/lzham_pthreads_threading.cpp"
                 ,0x2d);
  }
  return;
}

Assistant:

task_pool::task_pool(lzham_malloc_context malloc_context, uint num_threads) :
      m_task_stack(malloc_context),
      m_num_threads(0),
      m_tasks_available(0, 32767),
      m_malloc_context(malloc_context),
      m_num_outstanding_tasks(0),
      m_exit_flag(false)
   {
      utils::zero_object(m_threads);

      bool status = init(num_threads);
      LZHAM_VERIFY(status);
   }